

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Book.cpp
# Opt level: O2

void __thiscall Book::printProperties(Book *this)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Book Author: ");
  poVar1 = std::operator<<(poVar1,(string *)&this->author);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"Book Publisher: ");
  poVar1 = std::operator<<(poVar1,(string *)&this->publisher);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"Book Page: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->page);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void Book::printProperties() {
	cout << "Book Author: " << author << endl;
	cout << "Book Publisher: " << publisher << endl;
	cout << "Book Page: " << page << endl;
}